

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObject.cpp
# Opt level: O2

void __thiscall chrono::ChObj::ArchiveIN(ChObj *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<int> local_48;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  ChArchiveIn::VersionRead<chrono::ChObj>(marchive);
  local_30._value = &this->m_name;
  local_30._name = "m_name";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->m_identifier;
  local_48._name = "m_identifier";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->ChTime;
  local_60._name = "ChTime";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChObj::ArchiveIN(ChArchiveIn& marchive) {
    /*int version =*/ marchive.VersionRead<ChObj>();

    // stream out all member data
    marchive >> CHNVP(m_name);
    marchive >> CHNVP(m_identifier);
    marchive >> CHNVP(ChTime);
}